

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

int __thiscall
cbtAlignedObjectArray<MyPairIndex>::copy
          (cbtAlignedObjectArray<MyPairIndex> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  MyPairIndex *pMVar1;
  long lVar2;
  long in_RCX;
  int i;
  long lVar3;
  
  lVar2 = (long)(int)dst;
  lVar3 = lVar2 * 0xc;
  for (; lVar2 < (int)src; lVar2 = lVar2 + 1) {
    pMVar1 = this->m_data;
    *(undefined4 *)(in_RCX + 8 + lVar3) = *(undefined4 *)((long)&pMVar1->m_uidA1 + lVar3);
    *(undefined8 *)(in_RCX + lVar3) = *(undefined8 *)((long)&pMVar1->m_orgIndex + lVar3);
    lVar3 = lVar3 + 0xc;
  }
  return (int)lVar2;
}

Assistant:

SIMD_FORCE_INLINE void copy(int start, int end, T* dest) const
	{
		int i;
		for (i = start; i < end; ++i)
#ifdef BT_USE_PLACEMENT_NEW
			new (&dest[i]) T(m_data[i]);
#else
			dest[i] = m_data[i];
#endif  //BT_USE_PLACEMENT_NEW
	}